

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_xprt.c
# Opt level: O2

void svc_xprt_shutdown(void)

{
  ushort *puVar1;
  ushort uVar2;
  rbtree_x_part *prVar3;
  int iVar4;
  opr_rbtree_node *node;
  uint line;
  long lVar5;
  uint uVar6;
  pthread_rwlock_t *__rwlock;
  bool bVar7;
  
  if (initialized != '\x01') {
    return;
  }
  lVar5 = 0;
  while( true ) {
    prVar3 = svc_xprt_fd.xt.tree;
    if (lVar5 == 0xc1) {
      (*__ntirpc_pkg_params.free_size_)(svc_xprt_fd.xt.tree,0xd920);
      return;
    }
    __rwlock = &svc_xprt_fd.xt.tree[lVar5].lock;
    iVar4 = pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
    if (iVar4 != 0) break;
    while (node = opr_rbtree_first(&prVar3[lVar5].t), node != (opr_rbtree_node *)0x0) {
      opr_rbtree_remove(&prVar3[lVar5].t,node);
      iVar4 = pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
      if (iVar4 != 0) goto LAB_0011b3b3;
      uVar6 = (uint)*(ushort *)((long)&node[-0xc].left + 4);
      do {
        line = uVar6 | 0x20;
        puVar1 = (ushort *)((long)&node[-0xc].left + 4);
        LOCK();
        uVar2 = *puVar1;
        bVar7 = (ushort)uVar6 == uVar2;
        if (bVar7) {
          *puVar1 = (ushort)line;
        }
        else {
          uVar6 = (uint)uVar2;
        }
        UNLOCK();
      } while (!bVar7);
      if (((byte)__ntirpc_pkg_params.debug_flags & 0x10) != 0) {
        line = 0x175;
        svc_xprt_trace((SVCXPRT *)&node[-0x1a].red,"svc_destroy_it","svc_xprt_shutdown",0x175);
      }
      if ((uVar6 & 0x20) == 0) {
        svc_release_it((SVCXPRT *)&node[-0x1a].red,0x12723c,(char *)0x175,line);
      }
      iVar4 = pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
      if (iVar4 != 0) goto LAB_0011b3b3;
    }
    iVar4 = pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
    if (iVar4 != 0) break;
    iVar4 = pthread_rwlock_destroy((pthread_rwlock_t *)__rwlock);
    lVar5 = lVar5 + 1;
    if (iVar4 != 0) break;
  }
LAB_0011b3b3:
  abort();
}

Assistant:

void
svc_xprt_shutdown()
{
	struct rbtree_x_part *t;
	struct opr_rbtree_node *n;
	struct rpc_dplx_rec *rec;
	int p_ix;

	if (!initialized)
		return;

	p_ix = 0;
	while (p_ix < SVC_XPRT_PARTITIONS) {
		t = &svc_xprt_fd.xt.tree[p_ix];

		rwlock_wrlock(&t->lock);	/* t WLOCKED */
		while ((n = opr_rbtree_first(&t->t))) {
			rec = opr_containerof(n, struct rpc_dplx_rec, fd_node);

			/* prevent repeats, see svc_xprt_clear() */
			opr_rbtree_remove(&t->t, &rec->fd_node);

			/* fd_node is counted by initial xp_refcnt = 1,
			 * SVC_DESTROY() decrements that reference.
			 */
			rwlock_unlock(&t->lock);
			SVC_DESTROY(&rec->xprt);
			rwlock_wrlock(&t->lock);
		}		/* curr partition */
		rwlock_unlock(&t->lock);	/* t !LOCKED */
		rwlock_destroy(&t->lock);
		p_ix++;
	}			/* SVC_XPRT_PARTITIONS */

	/* free tree */
	mem_free(svc_xprt_fd.xt.tree,
		 SVC_XPRT_PARTITIONS * sizeof(struct rbtree_x_part));
}